

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O3

void squall::detail::call_setup<std::shared_ptr<Foo>>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,shared_ptr<Foo> *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  SQRESULT SVar1;
  runtime_error *prVar2;
  _Atomic_word _Var3;
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  obj._4_4_ = 0;
  obj._type = table->_type;
  obj._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj);
  sq_pushstring(vm,(name->_M_dataplus)._M_p,name->_M_string_length);
  SVar1 = sq_get(vm,-2);
  if (SVar1 < 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,"can\'t find such function: ",name);
    std::runtime_error::runtime_error(prVar2,(string *)&local_48);
    *(undefined ***)prVar2 = &PTR__runtime_error_0013d398;
    __cxa_throw(prVar2,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sq_remove(vm,-2);
  obj_00._4_4_ = 0;
  obj_00._type = table->_type;
  obj_00._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj_00);
  local_48._M_dataplus._M_p =
       (pointer)(args->super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (args->super___shared_ptr<Foo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48._M_string_length = 0;
    goto LAB_00108844;
  }
  local_48._M_string_length = (size_type)this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0010882b;
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      goto LAB_00108844;
    }
    _Var3 = this->_M_use_count;
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
LAB_0010882b:
    _Var3 = this->_M_use_count + 1;
    this->_M_use_count = _Var3;
  }
  this->_M_use_count = _Var3 + 1;
LAB_00108844:
  push_aux<std::shared_ptr<Foo>>(vm,(shared_ptr<Foo> *)&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  SVar1 = sq_call(vm,2,1,1);
  if (-1 < SVar1) {
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"function call failed: ",name);
  std::runtime_error::runtime_error(prVar2,(string *)&local_48);
  *(undefined ***)prVar2 = &PTR__runtime_error_0013d398;
  __cxa_throw(prVar2,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}